

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void flexfloat_sanitize(flexfloat_t *a)

{
  fp_t fVar1;
  _Bool _Var2;
  ulong uVar3;
  double dVar4;
  ulong uVar5;
  uint_t uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint8_t uVar13;
  ulong uVar14;
  
  fVar1 = a->value;
  uVar3 = flexfloat_exp(a);
  if (((a->desc).exp_bits == '\v') && ((a->desc).frac_bits == '4')) {
    return;
  }
  uVar10 = 0x7ff;
  if ((uVar3 == 0x7ff) || (uVar10 = uVar3, (a->desc).frac_bits == '4')) goto LAB_0012e6c8;
  iVar9 = fegetround();
  if (iVar9 == 0x800) {
    _Var2 = flexfloat_round_bit(a,uVar3);
    if (_Var2) {
      if (-1 < (long)fVar1) {
LAB_0012e69d:
        dVar4 = (double)flexfloat_rounding_value(a,uVar3,SUB81((ulong)fVar1 >> 0x3f,0));
        a->value = dVar4 + a->value;
      }
    }
    else {
      _Var2 = flexfloat_sticky_bit(a,uVar3);
      if (_Var2 && -1 < (long)fVar1) goto LAB_0012e69d;
    }
  }
  else if (iVar9 == 0x400) {
    _Var2 = flexfloat_round_bit(a,uVar3);
    if (_Var2) {
      if ((long)fVar1 < 0) goto LAB_0012e69d;
    }
    else {
      _Var2 = flexfloat_sticky_bit(a,uVar3);
      if (_Var2 && (long)fVar1 < 0) goto LAB_0012e69d;
    }
  }
  else if ((iVar9 == 0) && (_Var2 = flexfloat_nearest_rounding(a,uVar3), _Var2)) goto LAB_0012e69d;
  uVar10 = flexfloat_exp(a);
LAB_0012e6c8:
  bVar7 = (a->desc).exp_bits;
  uVar11 = -1L << (bVar7 & 0x3f);
  bVar8 = (a->desc).frac_bits;
  uVar3 = ((ulong)a->value & 0xfffffffffffff) >> (0x34 - bVar8 & 0x3f);
  uVar13 = (a->desc).frac_bits;
  if (((ulong)a->value & 0x7ff0000000000000) == 0) {
    uVar10 = (ulong)fVar1 & 0x8000000000000000;
    lVar12 = uVar3 << (0x34 - uVar13 & 0x3f);
  }
  else {
    if ((long)uVar10 < 1) {
      uVar6 = flexfloat_denorm_frac(a,uVar10);
      if (uVar6 == 0) {
        a->value = (fp_t)((ulong)fVar1 & 0x8000000000000000);
      }
      else if (bVar8 < 0x34) {
        iVar9 = 1 - (int)uVar10;
        bVar8 = (byte)iVar9;
        uVar3 = (uVar3 >> (bVar8 & 0x3f)) << (bVar8 & 0x3f);
        if (0x33 < iVar9) {
          uVar3 = 0;
        }
      }
      uVar14 = uVar10;
      if (uVar6 == 0) {
        return;
      }
    }
    else {
      uVar5 = ~uVar11;
      uVar14 = uVar5;
      if ((uVar10 != 0x7ff) && (uVar14 = uVar10, (long)uVar5 <= (long)uVar10)) {
        uVar3 = 0;
        uVar14 = uVar5;
      }
    }
    uVar10 = ((ulong)((int)(-1L << (bVar7 - 1 & 0x3f)) + (int)uVar14 + 1) << 0x34) +
             0x3ff0000000000000;
    if ((uVar11 ^ uVar14) == 0xffffffffffffffff) {
      uVar10 = 0x7ff0000000000000;
    }
    lVar12 = (uVar3 << (0x34 - uVar13 & 0x3f)) + ((ulong)fVar1 & 0x8000000000000000);
  }
  a->value = (fp_t)(lVar12 + uVar10);
  return;
}

Assistant:

void flexfloat_sanitize(flexfloat_t *a)
{
    bool sign;
    int_fast16_t exp;
    int_fast16_t inf_exp;
    uint_t frac;


    // Sign
    sign = flexfloat_sign(a);

    // Exponent
    exp = flexfloat_exp(a);

    // This case does not require to be sanitized (except for NaNs)
    if(a->desc.exp_bits  == NUM_BITS_EXP && a->desc.frac_bits == NUM_BITS_FRAC)
    {
#ifdef NAN_NORMALIZATION	    
        if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
        {
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
        CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
        }
#endif
        return;
    }

    // printf("enter sanitize: 0x%016lx s%d e%d m0x%013lx\n", CAST_TO_INT(a->value), sign, exp, CAST_TO_INT(a->value)&MASK_FRAC);

#ifdef FLEXFLOAT_ROUNDING
    // In these cases no rounding is needed
    if (!(exp == INF_EXP  || a->desc.frac_bits == NUM_BITS_FRAC))
    {
#ifdef FLEXFLOAT_FLAGS
        // Inexact results raise an exception
        if(flexfloat_round_bit(a, exp) || flexfloat_sticky_bit(a, exp))
            feraiseexcept(FE_INEXACT);
        // As rounding uses FP operations, we don't want to tarnish the accrued flags
        fexcept_t flags;
        fegetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        // Rounding mode
        int mode = fegetround();
        if(mode == FE_TONEAREST && flexfloat_nearest_rounding(a, exp))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_UPWARD && flexfloat_inf_rounding(a, exp, sign, 1))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_DOWNWARD && flexfloat_inf_rounding(a, exp, sign, 0))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
#ifdef FLEXFLOAT_FLAGS
        // Restore flags from before
        fesetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        //a->value = a->value;
        __asm__ __volatile__ ("" ::: "memory");

        // Recompute exponent value after rounding
        exp = flexfloat_exp(a);
    }
#endif

    // Exponent of NaN and Inf (target format)
    inf_exp = flexfloat_inf_exp(a->desc);

    // Mantissa
    frac = flexfloat_frac(a);

    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format - represented format also denormal
    {
        CAST_TO_INT(a->value) = flexfloat_denorm_pack(a->desc, sign, frac);
        return;
    }

   if(exp <= 0) // Denormalized value in the target format (saved in normalized format in the backend value)
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the underflow exception
        feraiseexcept(FE_UNDERFLOW);
#endif
        uint_t denorm = flexfloat_denorm_frac(a, exp);
        if(denorm == 0) // value too low to be represented, return zero
        {
            CAST_TO_INT(a->value) = PACK(sign, 0, 0);
            return;
        }
        else if(a->desc.frac_bits < NUM_BITS_FRAC) // Remove additional precision
        {
            int shift = - exp + 1;
            if(shift < NUM_BITS_FRAC)
            {
              frac >>= shift;
              frac <<= shift;
            }
            else
            {
              frac = UINT_C(0);
            }
        }
    }
    else if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
    {
        exp  = inf_exp;
#ifdef NAN_NORMALIZATION	
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
#endif	
    }
    else if(exp == INF_EXP) // Inf
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception, unless a DIV/0 exception had occured
        if (!fetestexcept(FE_DIVBYZERO))
            feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
    }
    else if(exp >= inf_exp) // Out of bounds for target format: set infinity
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception
        feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
        frac = UINT_C(0);
    }

    // printf("ENCODING: %d %d %lu\n", sign, exp, frac);
    CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
}